

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O3

void SampleConv_toU8(void *buffer,INT32 value)

{
  char cVar1;
  int iVar3;
  int iVar2;
  
  iVar3 = value >> 0x10;
  iVar2 = 0x7f;
  if (iVar3 < 0x7f) {
    iVar2 = iVar3;
  }
  cVar1 = (char)iVar2 + -0x80;
  if (iVar3 < -0x80) {
    cVar1 = '\0';
  }
  *(char *)buffer = cVar1;
  return;
}

Assistant:

static void SampleConv_toU8(void* buffer, INT32 value)
{
	value >>= 16;	// 24 bit -> 8 bit
	if (value < -0x80)
		value = -0x80;
	else if (value > +0x7F)
		value = +0x7F;
	*(UINT8*)buffer = (UINT8)(0x80 + value);
	return;
}